

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.h
# Opt level: O1

void __thiscall Argument::Argument(Argument *this,int argc,char **argv)

{
  pointer pcVar1;
  ulong __val;
  bool bVar2;
  double dVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  ulonglong uVar9;
  int *piVar10;
  long *plVar11;
  undefined8 uVar12;
  ulong uVar13;
  size_type *psVar14;
  double dVar15;
  char cVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  _Alloc_hider _Var18;
  char *pcVar19;
  float fVar20;
  string value;
  string __str;
  string param;
  string postfix;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  char *local_358;
  undefined8 local_350;
  char local_348;
  undefined7 uStack_347;
  double local_338;
  char **local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  long *local_2b8;
  uint local_2b0;
  long local_2a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288;
  undefined7 uStack_287;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [4];
  ios_base local_138 [264];
  
  this->_func = 2;
  this->_seedsize = 0x32;
  this->_samplesize = 1000;
  this->_probEdge = 0.1;
  this->_budget = 5000.0;
  this->_eps = 0.1;
  this->_feps = 0.1;
  this->_delta = -1.0;
  this->_percent = 0.99999;
  this->_budpercent = 0.0001;
  this->_normalpha = 0.2;
  this->_model = IC;
  local_2d8 = &this->_graphname;
  local_2f8 = &(this->_graphname).field_2;
  (this->_graphname)._M_dataplus._M_p = (pointer)local_2f8;
  local_330 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"facebook","");
  local_300 = &(this->_mode).field_2;
  (this->_mode)._M_dataplus._M_p = (pointer)local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_mode,"g","");
  local_2e0 = &this->_dir;
  local_308 = &(this->_dir).field_2;
  (this->_dir)._M_dataplus._M_p = (pointer)local_308;
  local_360 = &this->_mode;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"graphInfo","");
  local_2e8 = &this->_resultFolder;
  local_310 = &(this->_resultFolder).field_2;
  (this->_resultFolder)._M_dataplus._M_p = (pointer)local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"result","");
  local_318 = &(this->_algName).field_2;
  (this->_algName)._M_dataplus._M_p = (pointer)local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->_algName,"opim-b","");
  local_2f0 = &this->_probDist;
  local_320 = &(this->_probDist).field_2;
  (this->_probDist)._M_dataplus._M_p = (pointer)local_320;
  local_370 = &this->_algName;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"load","");
  local_368 = &this->_outFileName;
  local_328 = &(this->_outFileName).field_2;
  (this->_outFileName)._M_dataplus._M_p = (pointer)local_328;
  (this->_outFileName)._M_string_length = 0;
  (this->_outFileName).field_2._M_local_buf[0] = '\0';
  local_298._M_allocated_capacity = (size_type)&local_288;
  local_298._8_8_ = 0;
  local_288 = 0;
  local_358 = &local_348;
  local_350 = 0;
  local_348 = '\0';
  if (1 < argc) {
    dVar15 = 4.94065645841247e-324;
    local_338 = (double)(ulong)(uint)argc;
    do {
      if (*local_330[(long)dVar15] != '-') break;
      std::__cxx11::string::string
                ((string *)&local_390,local_330[(long)dVar15],(allocator *)&local_2b8);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_1b8,(string *)&local_390,_S_out|_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_1b8,(string *)local_298._M_local_buf,'=');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_1b8,(string *)&local_358,'=');
      iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
      pcVar19 = local_358;
      if (iVar7 == 0) {
        piVar10 = __errno_location();
        iVar7 = *piVar10;
        *piVar10 = 0;
        lVar8 = strtol(pcVar19,(char **)&local_390,10);
        if (local_390._M_dataplus._M_p == pcVar19) {
          std::__throw_invalid_argument("stoi");
        }
        else if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar10 != 0x22)) {
          if (*piVar10 == 0) {
            *piVar10 = iVar7;
          }
          this->_func = (int)lVar8;
          goto LAB_00118a09;
        }
        std::__throw_out_of_range("stoi");
LAB_00119119:
        std::__throw_out_of_range("stoi");
LAB_00119125:
        std::__throw_invalid_argument("stoi");
LAB_00119131:
        std::__throw_invalid_argument("stoull");
LAB_0011913d:
        std::__throw_invalid_argument("stof");
LAB_00119149:
        std::__throw_out_of_range("stoull");
LAB_00119155:
        std::__throw_invalid_argument("stod");
LAB_00119161:
        std::__throw_out_of_range("stof");
LAB_0011916d:
        std::__throw_invalid_argument("stod");
LAB_00119179:
        std::__throw_out_of_range("stod");
LAB_00119185:
        std::__throw_invalid_argument("stod");
LAB_00119191:
        std::__throw_out_of_range("stod");
LAB_0011919d:
        std::__throw_invalid_argument("stod");
LAB_001191a9:
        std::__throw_out_of_range("stod");
LAB_001191b5:
        std::__throw_invalid_argument("stod");
LAB_001191c1:
        std::__throw_out_of_range("stod");
LAB_001191cd:
        std::__throw_invalid_argument("stod");
LAB_001191d9:
        std::__throw_out_of_range("stod");
LAB_001191e5:
        uVar12 = std::__throw_out_of_range("stod");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_298) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((int *)local_258._M_dataplus._M_p != piVar10) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_1b8[0]._M_dataplus._M_p != pcVar19) {
          operator_delete(local_1b8[0]._M_dataplus._M_p,
                          local_1b8[0].field_2._M_allocated_capacity + 1);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358,CONCAT71(uStack_347,local_348) + 1);
        }
        if ((undefined1 *)local_298._M_allocated_capacity != &local_288) {
          operator_delete((void *)local_298._M_allocated_capacity,CONCAT71(uStack_287,local_288) + 1
                         );
        }
        plVar11 = (long *)(local_368->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_328) {
          operator_delete(plVar11,local_328->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_2f0->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_320) {
          operator_delete(plVar11,local_320->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_370->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_318) {
          operator_delete(plVar11,local_318->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_2e8->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_310) {
          operator_delete(plVar11,local_310->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_2e0->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_308) {
          operator_delete(plVar11,local_308->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_360->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_300) {
          operator_delete(plVar11,local_300->_M_allocated_capacity + 1);
        }
        plVar11 = (long *)(local_2d8->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11 != local_2f8) {
          operator_delete(plVar11,local_2f8->_M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar12);
      }
      iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
      pcVar19 = local_358;
      if (iVar7 == 0) {
        piVar10 = __errno_location();
        iVar7 = *piVar10;
        *piVar10 = 0;
        lVar8 = strtol(pcVar19,(char **)&local_390,10);
        if (local_390._M_dataplus._M_p != pcVar19) {
          if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar10 != 0x22)) {
            if (*piVar10 == 0) {
              *piVar10 = iVar7;
            }
            this->_seedsize = (int)lVar8;
            goto LAB_00118a09;
          }
          goto LAB_00119119;
        }
        goto LAB_00119125;
      }
      iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
      pcVar19 = local_358;
      if (iVar7 != 0) {
        iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
        pcVar19 = local_358;
        if (iVar7 == 0) {
          piVar10 = __errno_location();
          iVar7 = *piVar10;
          *piVar10 = 0;
          fVar20 = strtof(pcVar19,(char **)&local_390);
          if (local_390._M_dataplus._M_p == pcVar19) goto LAB_0011913d;
          if (*piVar10 == 0) {
            *piVar10 = iVar7;
LAB_0011884e:
            this->_probEdge = fVar20;
            goto LAB_00118a09;
          }
          if (*piVar10 != 0x22) goto LAB_0011884e;
          goto LAB_00119161;
        }
        iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
        pcVar19 = local_358;
        if (iVar7 == 0) {
          piVar10 = __errno_location();
          iVar7 = *piVar10;
          *piVar10 = 0;
          dVar3 = strtod(pcVar19,(char **)&local_390);
          if (local_390._M_dataplus._M_p == pcVar19) goto LAB_00119155;
          if (*piVar10 == 0) {
            *piVar10 = iVar7;
LAB_0011889b:
            this->_eps = dVar3;
            goto LAB_00118a09;
          }
          if (*piVar10 != 0x22) goto LAB_0011889b;
          goto LAB_00119179;
        }
        iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
        pcVar19 = local_358;
        if (iVar7 == 0) {
          piVar10 = __errno_location();
          iVar7 = *piVar10;
          *piVar10 = 0;
          dVar3 = strtod(pcVar19,(char **)&local_390);
          if (local_390._M_dataplus._M_p == pcVar19) goto LAB_0011916d;
          if (*piVar10 == 0) {
            *piVar10 = iVar7;
LAB_001188e8:
            this->_feps = dVar3;
            goto LAB_00118a09;
          }
          if (*piVar10 != 0x22) goto LAB_001188e8;
          goto LAB_00119191;
        }
        iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
        pcVar19 = local_358;
        if (iVar7 == 0) {
          piVar10 = __errno_location();
          iVar7 = *piVar10;
          *piVar10 = 0;
          dVar3 = strtod(pcVar19,(char **)&local_390);
          if (local_390._M_dataplus._M_p == pcVar19) goto LAB_00119185;
          if (*piVar10 == 0) {
            *piVar10 = iVar7;
LAB_00118935:
            this->_delta = dVar3;
            goto LAB_00118a09;
          }
          if (*piVar10 != 0x22) goto LAB_00118935;
          goto LAB_001191a9;
        }
        iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
        pcVar19 = local_358;
        if (iVar7 == 0) {
          piVar10 = __errno_location();
          iVar7 = *piVar10;
          *piVar10 = 0;
          dVar3 = strtod(pcVar19,(char **)&local_390);
          if (local_390._M_dataplus._M_p == pcVar19) goto LAB_0011919d;
          if (*piVar10 == 0) {
            *piVar10 = iVar7;
LAB_00118982:
            this->_budget = dVar3;
            goto LAB_00118a09;
          }
          if (*piVar10 != 0x22) goto LAB_00118982;
          goto LAB_001191c1;
        }
        iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
        pcVar19 = local_358;
        if (iVar7 != 0) {
          iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
          pcVar19 = local_358;
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
            if (iVar7 == 0) {
              iVar7 = std::__cxx11::string::compare((char *)&local_358);
              this->_model = (uint)(iVar7 == 0);
            }
            else {
              iVar7 = std::__cxx11::string::compare(local_298._M_local_buf);
              pbVar5 = local_360;
              pbVar4 = local_370;
              pbVar17 = local_2d8;
              if (((((iVar7 == 0) ||
                    (iVar7 = std::__cxx11::string::compare(local_298._M_local_buf), pbVar17 = pbVar5
                    , iVar7 == 0)) ||
                   (iVar7 = std::__cxx11::string::compare(local_298._M_local_buf),
                   pbVar17 = local_2e0, iVar7 == 0)) ||
                  ((iVar7 = std::__cxx11::string::compare(local_298._M_local_buf),
                   pbVar17 = local_2e8, iVar7 == 0 ||
                   (iVar7 = std::__cxx11::string::compare(local_298._M_local_buf), pbVar17 = pbVar4,
                   iVar7 == 0)))) ||
                 (iVar7 = std::__cxx11::string::compare(local_298._M_local_buf), pbVar17 = local_2f0
                 , iVar7 == 0)) {
                std::__cxx11::string::_M_assign((string *)pbVar17);
              }
            }
            goto LAB_00118a09;
          }
          piVar10 = __errno_location();
          iVar7 = *piVar10;
          *piVar10 = 0;
          dVar3 = strtod(pcVar19,(char **)&local_390);
          if (local_390._M_dataplus._M_p != pcVar19) {
            if (*piVar10 == 0) {
              *piVar10 = iVar7;
            }
            else if (*piVar10 == 0x22) goto LAB_001191e5;
            this->_normalpha = dVar3;
            goto LAB_00118a09;
          }
          goto LAB_001191cd;
        }
        piVar10 = __errno_location();
        iVar7 = *piVar10;
        *piVar10 = 0;
        dVar3 = strtod(pcVar19,(char **)&local_390);
        if (local_390._M_dataplus._M_p == pcVar19) goto LAB_001191b5;
        if (*piVar10 == 0) {
          *piVar10 = iVar7;
LAB_001189cc:
          this->_budpercent = dVar3;
          goto LAB_00118a09;
        }
        if (*piVar10 != 0x22) goto LAB_001189cc;
        goto LAB_001191d9;
      }
      piVar10 = __errno_location();
      iVar7 = *piVar10;
      *piVar10 = 0;
      uVar9 = strtoull(pcVar19,(char **)&local_390,10);
      if (local_390._M_dataplus._M_p == pcVar19) goto LAB_00119131;
      if (*piVar10 != 0) {
        if (*piVar10 != 0x22) goto LAB_00118802;
        goto LAB_00119149;
      }
      *piVar10 = iVar7;
LAB_00118802:
      this->_samplesize = uVar9;
LAB_00118a09:
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      dVar15 = (double)((long)dVar15 + 1);
    } while (local_338 != dVar15);
  }
  local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"_minBound","");
  pbVar4 = local_360;
  iVar7 = std::__cxx11::string::compare((char *)local_360);
  pcVar19 = "_vanilla";
  if ((iVar7 == 0) ||
     (iVar7 = std::__cxx11::string::compare((char *)pbVar4), pbVar4 = local_360, iVar7 == 0)) {
LAB_00118acf:
    std::__cxx11::string::_M_replace
              ((ulong)local_1b8,0,(char *)local_1b8[0]._M_string_length,(ulong)pcVar19);
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)local_360);
    pcVar19 = "_lastBound";
    if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0))
    goto LAB_00118acf;
  }
  pbVar4 = local_370;
  iVar7 = std::__cxx11::string::compare((char *)local_370);
  if ((((((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0)) ||
        (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0)) ||
       (((iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0 ||
         (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0)) ||
        ((iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0 ||
         ((iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0 ||
          (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0)))))))) ||
      (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0)) ||
     ((((iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0 ||
        (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0)) ||
       (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0)) ||
      ((iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0 ||
       (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0)))))) {
    pcVar1 = (this->_graphname)._M_dataplus._M_p;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,pcVar1,pcVar1 + (this->_graphname)._M_string_length);
    std::operator+(&local_1d8,local_370,local_1b8);
    local_330 = (char **)this->_budpercent;
    local_338 = this->_normalpha;
    local_2c0 = this->_percent;
    local_2c8 = this->_eps;
    local_2d0 = this->_feps;
    pcVar1 = (this->_probDist)._M_dataplus._M_p;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar1,pcVar1 + (this->_probDist)._M_string_length);
    IOcontroller::get_out_file_name_budget
              (&local_390,&local_218,&local_1d8,(double)local_330,local_338,local_2c0,local_2c8,
               local_2d0,&local_238,this->_probEdge);
    std::__cxx11::string::operator=((string *)local_368,(string *)&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    _Var18._M_p = local_218._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == &local_218.field_2) goto LAB_00118edc;
  }
  else {
    pcVar1 = (this->_graphname)._M_dataplus._M_p;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar1,pcVar1 + (this->_graphname)._M_string_length);
    std::operator+(&local_1f8,local_370,local_1b8);
    iVar7 = this->_seedsize;
    pcVar1 = (this->_probDist)._M_dataplus._M_p;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,pcVar1,pcVar1 + (this->_probDist)._M_string_length);
    IOcontroller::get_out_file_name
              (&local_390,&local_258,&local_1f8,iVar7,&local_278,this->_probEdge);
    std::__cxx11::string::operator=((string *)local_368,(string *)&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    local_218.field_2._M_allocated_capacity = local_258.field_2._M_allocated_capacity;
    _Var18._M_p = local_258._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p == &local_258.field_2) goto LAB_00118edc;
  }
  operator_delete(_Var18._M_p,local_218.field_2._M_allocated_capacity + 1);
LAB_00118edc:
  pbVar4 = local_368;
  if (this->_model == LT) {
    std::operator+(&local_390,"LT_",local_368);
    std::__cxx11::string::operator=((string *)pbVar4,(string *)&local_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar4 = local_370;
  iVar7 = std::__cxx11::string::compare((char *)local_370);
  if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare((char *)pbVar4), iVar7 == 0)) {
    __val = this->_samplesize;
    cVar16 = '\x01';
    if (9 < __val) {
      uVar13 = __val;
      cVar6 = '\x04';
      do {
        cVar16 = cVar6;
        if (uVar13 < 100) {
          cVar16 = cVar16 + -2;
          goto LAB_00118fb6;
        }
        if (uVar13 < 1000) {
          cVar16 = cVar16 + -1;
          goto LAB_00118fb6;
        }
        if (uVar13 < 10000) goto LAB_00118fb6;
        bVar2 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar6 = cVar16 + '\x04';
      } while (bVar2);
      cVar16 = cVar16 + '\x01';
    }
LAB_00118fb6:
    local_2b8 = local_2a8;
    std::__cxx11::string::_M_construct((ulong)&local_2b8,cVar16);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b8,local_2b0,__val);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x133bcf);
    psVar14 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_390.field_2._M_allocated_capacity = *psVar14;
      local_390.field_2._8_8_ = plVar11[3];
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    }
    else {
      local_390.field_2._M_allocated_capacity = *psVar14;
      local_390._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_390._M_string_length = plVar11[1];
    *plVar11 = (long)psVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_368,(ulong)local_390._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != local_2a8) {
      operator_delete(local_2b8,local_2a8[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
    operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,CONCAT71(uStack_347,local_348) + 1);
  }
  if ((undefined1 *)local_298._M_allocated_capacity != &local_288) {
    operator_delete((void *)local_298._M_allocated_capacity,CONCAT71(uStack_287,local_288) + 1);
  }
  return;
}

Assistant:

Argument(int argc, char* argv[])
    {
        std::string param, value;
        for (int ind = 1; ind < argc; ind++)
        {
            if (argv[ind][0] != '-') {
                break;
            }
            std::stringstream sstr(argv[ind]);
            getline(sstr, param, '=');
            getline(sstr, value, '=');
            if (!param.compare("-func")) {
                _func = stoi(value);
            }
            else if (!param.compare("-seedsize")) {
                _seedsize = stoi(value);
            }
            else if (!param.compare("-samplesize")) {
                _samplesize = stoull(value);
            }
            else if (!param.compare("-pedge")) {
                _probEdge = stof(value);
            }
            else if (!param.compare("-eps")) {
                _eps = stod(value);
            }
            else if (!param.compare("-feps")) {
                _feps = stod(value);
            }
            else if (!param.compare("-delta")) {
                _delta = stod(value);
            }
            else if (!param.compare("-budget")) {
                _budget = stod(value);
            }
            else if (!param.compare("-budper")) {
                _budpercent = stod(value);
            }
            else if (!param.compare("-nalpha")) {
                _normalpha = stod(value);
            }
            else if (!param.compare("-model")) {
                _model = value == "LT" ? LT : IC;
            }
            else if (!param.compare("-gname")) {
                _graphname = value;
            }
            else if (!param.compare("-mode")) {
                _mode = value;
            }
            else if (!param.compare("-dir")) {
                _dir = value;
            }
            else if (!param.compare("-outpath")) {
                _resultFolder = value;
            }
            else if (!param.compare("-alg")) {
                _algName = value;
            }
            else if (!param.compare("-pdist")) {
                _probDist = value;
            }
        }
        std::string postfix = "_minBound"; // Default is to use the minimum upper bound among all the rounds
        if (_mode == "0" || _mode == "vanilla") {
            postfix = "_vanilla";
        }
        else if (_mode == "1" || _mode == "last") {
            postfix = "_lastBound";
        }
        if (_algName == "opim-b" || _algName == "OPIM-B" ||
            _algName == "opim-b-n" || _algName == "OPIM-B-N" ||
            _algName == "opim-b-fe" || _algName == "OPIM-B-FE" ||
            _algName == "opim-ba" || _algName == "OPIM-BA" ||
            _algName == "opim-b-fa" || _algName == "OPIM-B-FA" ||
            _algName == "opim-a" || _algName == "OPIM-A" ||
            _algName == "opim-a-f" || _algName == "OPIM-A-F") {
            _outFileName = TIO::get_out_file_name_budget(_graphname, _algName + postfix, _budpercent,
                    _normalpha, _percent, _eps, _feps, _probDist, _probEdge);
        }
        else {
            _outFileName = TIO::get_out_file_name(_graphname, _algName + postfix, _seedsize, _probDist, _probEdge);
        }
        if (_model == LT) {
            _outFileName = "LT_" + _outFileName;
        }
        if (_algName == "OPIM" || _algName == "opim") {
            _outFileName += "_s" + std::to_string(_samplesize);
        }
    }